

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linear_workflow.cpp
# Opt level: O0

void __thiscall ON_LinearWorkflow::SetPostProcessGamma(ON_LinearWorkflow *this,float gamma)

{
  ON_InternalXMLImpl *this_00;
  wchar_t *path_to_node;
  float fValue;
  ON_XMLVariant local_110;
  float local_14;
  ON_LinearWorkflow *pOStack_10;
  float gamma_local;
  ON_LinearWorkflow *this_local;
  
  this_00 = &this->_impl->super_ON_InternalXMLImpl;
  local_14 = gamma;
  pOStack_10 = this;
  path_to_node = XMLPath();
  fValue = ClampGamma(local_14);
  ::ON_XMLVariant::ON_XMLVariant(&local_110,fValue);
  ON_InternalXMLImpl::SetParameter(this_00,path_to_node,L"gamma",&local_110);
  ::ON_XMLVariant::~ON_XMLVariant(&local_110);
  return;
}

Assistant:

void ON_LinearWorkflow::SetPostProcessGamma(float gamma)
{
  _impl->SetParameter(XMLPath(), ON_RDK_POST_PROCESS_GAMMA, ClampGamma(gamma));
}